

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpdebug.c
# Opt level: O0

void UpnpPrintf(Upnp_LogLevel DLevel,Dbg_Module Module,char *DbgFileName,int DbgLineNo,char *FmtStr,
               ...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [40];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list ArgList;
  char *FmtStr_local;
  int DbgLineNo_local;
  char *DbgFileName_local;
  Dbg_Module Module_local;
  Upnp_LogLevel DLevel_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if ((initwascalled != 0) &&
     (local_d0 = in_R9, iVar1 = DebugAtThisLevel(DLevel,Module), iVar1 != 0)) {
    pthread_mutex_lock((pthread_mutex_t *)&GlobalDebugMutex);
    if (fp == (FILE *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&GlobalDebugMutex);
    }
    else {
      ArgList[0].overflow_arg_area = local_f8;
      ArgList[0]._0_8_ = &stack0x00000008;
      local_44 = 0x30;
      local_48 = 0x28;
      if (DbgFileName != (char *)0x0) {
        UpnpDisplayFileAndLine(fp,DbgFileName,DbgLineNo,DLevel,Module);
        vfprintf((FILE *)fp,FmtStr,&local_48);
        fflush((FILE *)fp);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&GlobalDebugMutex);
    }
  }
  return;
}

Assistant:

void UpnpPrintf(Upnp_LogLevel DLevel,
	Dbg_Module Module,
	const char *DbgFileName,
	int DbgLineNo,
	const char *FmtStr,
	...)
{
	/*fprintf(stderr, "UpnpPrintf: fp %p level %d glev %d mod %d DEBUG_ALL
	  %d\n", fp, DLevel, g_log_level, Module, DEBUG_ALL);*/
	va_list ArgList;

	if (!initwascalled) {
		return;
	}

	if (!DebugAtThisLevel(DLevel, Module))
		return;
	ithread_mutex_lock(&GlobalDebugMutex);
	if (fp == NULL) {
		ithread_mutex_unlock(&GlobalDebugMutex);
		return;
	}

	va_start(ArgList, FmtStr);
	if (DbgFileName) {
		UpnpDisplayFileAndLine(
			fp, DbgFileName, DbgLineNo, DLevel, Module);
		vfprintf(fp, FmtStr, ArgList);
		fflush(fp);
	}
	va_end(ArgList);
	ithread_mutex_unlock(&GlobalDebugMutex);
}